

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::write<char,fmt::v8::appender>(appender out,char *value)

{
  size_t sVar1;
  appender aVar2;
  
  if (value != (char *)0x0) {
    sVar1 = strlen(value);
    aVar2 = copy_str_noinline<char,char_const*,fmt::v8::appender>(value,value + sVar1,out);
    return (appender)aVar2.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  }
  throw_format_error("string pointer is null");
}

Assistant:

FMT_CONSTEXPR_CHAR_TRAITS auto write(OutputIt out, const Char* value)
    -> OutputIt {
  if (!value) {
    throw_format_error("string pointer is null");
  } else {
    out = write(out, basic_string_view<Char>(value));
  }
  return out;
}